

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O1

void snga_dot_local_patch
               (Integer atype,Integer andim,Integer *loA,Integer *hiA,Integer *ldA,void *A_ptr,
               void *B_ptr,int *alen,void *retval)

{
  float fVar1;
  float fVar2;
  double dVar3;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  Integer baseldA [7];
  Integer bunit [7];
  long lStack_e0;
  undefined1 local_d8 [48];
  long local_a8 [8];
  long local_68 [7];
  
  lVar18 = 1;
  if (1 < andim) {
    lVar10 = 1;
    do {
      lVar18 = lVar18 * ((hiA[lVar10] - loA[lVar10]) + 1);
      lVar10 = lVar10 + 1;
    } while (andim != lVar10);
  }
  lStack_e0 = 0;
  local_68[0] = 1;
  local_68[1] = 1;
  local_a8[0] = *ldA;
  local_a8[1] = *ldA * ldA[1];
  if (2 < andim) {
    memset(local_d8,0,andim * 8 - 0x10);
    lVar11 = 2;
    lVar10 = local_a8[1];
    lVar12 = local_68[1];
    do {
      lVar12 = lVar12 * ((hiA[lVar11 + -1] - loA[lVar11 + -1]) + 1);
      local_68[lVar11] = lVar12;
      lVar10 = lVar10 * ldA[lVar11];
      local_a8[lVar11] = lVar10;
      lVar11 = lVar11 + 1;
    } while (andim != lVar11);
  }
  switch(atype) {
  case 0x3e9:
    if (lVar18 < 1) {
      iVar16 = 0;
    }
    else {
      lVar10 = *hiA;
      lVar12 = *loA;
      iVar16 = 0;
      lVar11 = 0;
      do {
        if (andim < 2) {
          lVar17 = 0;
        }
        else {
          lVar14 = 0;
          lVar17 = 0;
          do {
            lVar15 = *(long *)(local_d8 + lVar14 * 8 + -8);
            if ((lVar11 + 1) % local_68[lVar14 + 1] == 0) {
              *(long *)(local_d8 + lVar14 * 8 + -8) = lVar15 + 1;
            }
            lVar17 = lVar17 + lVar15 * local_a8[lVar14];
            lVar15 = 0;
            if (*(long *)(local_d8 + lVar14 * 8 + -8) <= hiA[lVar14 + 1] - loA[lVar14 + 1]) {
              lVar15 = *(long *)(local_d8 + lVar14 * 8 + -8);
            }
            *(long *)(local_d8 + lVar14 * 8 + -8) = lVar15;
            lVar14 = lVar14 + 1;
          } while (andim + -1 != lVar14);
        }
        if (lVar12 <= lVar10) {
          lVar14 = 0;
          do {
            iVar16 = iVar16 + *(int *)((long)B_ptr + lVar14 * 4 + lVar17 * 4) *
                              *(int *)((long)A_ptr + lVar14 * 4 + lVar17 * 4);
            lVar14 = lVar14 + 1;
          } while ((lVar10 - lVar12) + 1 != lVar14);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar18);
    }
    *alen = *alen + iVar16;
    break;
  case 0x3ea:
    if (lVar18 < 1) {
      lVar10 = 0;
    }
    else {
      lVar12 = *hiA;
      lVar11 = *loA;
      lVar10 = 0;
      lVar17 = 0;
      do {
        if (andim < 2) {
          lVar14 = 0;
        }
        else {
          lVar15 = 0;
          lVar14 = 0;
          do {
            lVar13 = *(long *)(local_d8 + lVar15 * 8 + -8);
            if ((lVar17 + 1) % local_68[lVar15 + 1] == 0) {
              *(long *)(local_d8 + lVar15 * 8 + -8) = lVar13 + 1;
            }
            lVar14 = lVar14 + lVar13 * local_a8[lVar15];
            lVar13 = 0;
            if (*(long *)(local_d8 + lVar15 * 8 + -8) <= hiA[lVar15 + 1] - loA[lVar15 + 1]) {
              lVar13 = *(long *)(local_d8 + lVar15 * 8 + -8);
            }
            *(long *)(local_d8 + lVar15 * 8 + -8) = lVar13;
            lVar15 = lVar15 + 1;
          } while (andim + -1 != lVar15);
        }
        if (lVar11 <= lVar12) {
          lVar15 = 0;
          do {
            lVar10 = lVar10 + *(long *)((long)B_ptr + lVar15 * 8 + lVar14 * 8) *
                              *(long *)((long)A_ptr + lVar15 * 8 + lVar14 * 8);
            lVar15 = lVar15 + 1;
          } while ((lVar12 - lVar11) + 1 != lVar15);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != lVar18);
    }
    *(long *)alen = *(long *)alen + lVar10;
    break;
  case 0x3eb:
    if (lVar18 < 1) {
      fVar19 = 0.0;
    }
    else {
      lVar10 = *hiA;
      lVar12 = *loA;
      fVar19 = 0.0;
      lVar11 = 0;
      do {
        if (andim < 2) {
          lVar17 = 0;
        }
        else {
          lVar14 = 0;
          lVar17 = 0;
          do {
            lVar15 = *(long *)(local_d8 + lVar14 * 8 + -8);
            if ((lVar11 + 1) % local_68[lVar14 + 1] == 0) {
              *(long *)(local_d8 + lVar14 * 8 + -8) = lVar15 + 1;
            }
            lVar17 = lVar17 + lVar15 * local_a8[lVar14];
            lVar15 = 0;
            if (*(long *)(local_d8 + lVar14 * 8 + -8) <= hiA[lVar14 + 1] - loA[lVar14 + 1]) {
              lVar15 = *(long *)(local_d8 + lVar14 * 8 + -8);
            }
            *(long *)(local_d8 + lVar14 * 8 + -8) = lVar15;
            lVar14 = lVar14 + 1;
          } while (andim + -1 != lVar14);
        }
        if (lVar12 <= lVar10) {
          lVar14 = 0;
          do {
            fVar19 = fVar19 + *(float *)((long)A_ptr + lVar14 * 4 + lVar17 * 4) *
                              *(float *)((long)B_ptr + lVar14 * 4 + lVar17 * 4);
            lVar14 = lVar14 + 1;
          } while ((lVar10 - lVar12) + 1 != lVar14);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar18);
    }
    *alen = (int)(fVar19 + (float)*alen);
    break;
  case 0x3ec:
    if (lVar18 < 1) {
      dVar5 = 0.0;
    }
    else {
      lVar10 = *hiA;
      lVar12 = *loA;
      dVar5 = 0.0;
      lVar11 = 0;
      do {
        if (andim < 2) {
          lVar17 = 0;
        }
        else {
          lVar14 = 0;
          lVar17 = 0;
          do {
            lVar15 = *(long *)(local_d8 + lVar14 * 8 + -8);
            if ((lVar11 + 1) % local_68[lVar14 + 1] == 0) {
              *(long *)(local_d8 + lVar14 * 8 + -8) = lVar15 + 1;
            }
            lVar17 = lVar17 + lVar15 * local_a8[lVar14];
            lVar15 = 0;
            if (*(long *)(local_d8 + lVar14 * 8 + -8) <= hiA[lVar14 + 1] - loA[lVar14 + 1]) {
              lVar15 = *(long *)(local_d8 + lVar14 * 8 + -8);
            }
            *(long *)(local_d8 + lVar14 * 8 + -8) = lVar15;
            lVar14 = lVar14 + 1;
          } while (andim + -1 != lVar14);
        }
        if (lVar12 <= lVar10) {
          lVar14 = 0;
          do {
            dVar5 = dVar5 + *(double *)((long)A_ptr + lVar14 * 8 + lVar17 * 8) *
                            *(double *)((long)B_ptr + lVar14 * 8 + lVar17 * 8);
            lVar14 = lVar14 + 1;
          } while ((lVar10 - lVar12) + 1 != lVar14);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar18);
    }
    *(double *)alen = dVar5 + *(double *)alen;
    break;
  default:
    pnga_error("snga_dot_local_patch: type not supported",atype);
    return;
  case 0x3ee:
    if (lVar18 < 1) {
      fVar19 = 0.0;
      fVar20 = 0.0;
    }
    else {
      lVar10 = *hiA;
      lVar12 = *loA;
      fVar19 = 0.0;
      fVar20 = 0.0;
      lVar11 = 0;
      do {
        if (andim < 2) {
          lVar17 = 0;
        }
        else {
          lVar14 = 0;
          lVar17 = 0;
          do {
            lVar15 = *(long *)(local_d8 + lVar14 * 8 + -8);
            if ((lVar11 + 1) % local_68[lVar14 + 1] == 0) {
              *(long *)(local_d8 + lVar14 * 8 + -8) = lVar15 + 1;
            }
            lVar17 = lVar17 + lVar15 * local_a8[lVar14];
            lVar15 = 0;
            if (*(long *)(local_d8 + lVar14 * 8 + -8) <= hiA[lVar14 + 1] - loA[lVar14 + 1]) {
              lVar15 = *(long *)(local_d8 + lVar14 * 8 + -8);
            }
            *(long *)(local_d8 + lVar14 * 8 + -8) = lVar15;
            lVar14 = lVar14 + 1;
          } while (andim + -1 != lVar14);
        }
        if (lVar12 <= lVar10) {
          lVar14 = 0;
          do {
            fVar1 = *(float *)((long)B_ptr + lVar14 * 8 + lVar17 * 8);
            fVar2 = *(float *)((long)B_ptr + lVar14 * 8 + lVar17 * 8 + 4);
            uVar4 = *(undefined8 *)((long)A_ptr + lVar14 * 8 + lVar17 * 8);
            fVar21 = (float)uVar4;
            fVar22 = (float)((ulong)uVar4 >> 0x20);
            fVar19 = fVar19 + fVar1 * fVar21 + fVar22 * -fVar2;
            fVar20 = fVar20 + fVar1 * fVar22 + fVar21 * fVar2;
            lVar14 = lVar14 + 1;
          } while ((lVar10 - lVar12) + 1 != lVar14);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar18);
    }
    *(ulong *)alen =
         CONCAT44((float)((ulong)*(undefined8 *)alen >> 0x20) + fVar20,
                  (float)*(undefined8 *)alen + fVar19);
    break;
  case 0x3ef:
    if (lVar18 < 1) {
      dVar5 = 0.0;
      dVar6 = 0.0;
    }
    else {
      lVar10 = *hiA;
      lVar12 = *loA;
      dVar5 = 0.0;
      dVar6 = 0.0;
      lVar11 = 0;
      do {
        if (andim < 2) {
          lVar17 = 0;
        }
        else {
          lVar14 = 0;
          lVar17 = 0;
          do {
            lVar15 = *(long *)(local_d8 + lVar14 * 8 + -8);
            if ((lVar11 + 1) % local_68[lVar14 + 1] == 0) {
              *(long *)(local_d8 + lVar14 * 8 + -8) = lVar15 + 1;
            }
            lVar17 = lVar17 + lVar15 * local_a8[lVar14];
            lVar15 = 0;
            if (*(long *)(local_d8 + lVar14 * 8 + -8) <= hiA[lVar14 + 1] - loA[lVar14 + 1]) {
              lVar15 = *(long *)(local_d8 + lVar14 * 8 + -8);
            }
            *(long *)(local_d8 + lVar14 * 8 + -8) = lVar15;
            lVar14 = lVar14 + 1;
          } while (andim + -1 != lVar14);
        }
        if (lVar12 <= lVar10) {
          lVar17 = lVar17 << 4;
          lVar14 = (lVar10 - lVar12) + 1;
          do {
            dVar3 = *(double *)((long)B_ptr + lVar17 + 8);
            dVar8 = *(double *)((long)A_ptr + lVar17);
            dVar9 = ((double *)((long)A_ptr + lVar17))[1];
            dVar5 = dVar5 + *(double *)((long)B_ptr + lVar17) * dVar8 + dVar9 * -dVar3;
            dVar6 = dVar6 + *(double *)((long)B_ptr + lVar17) * dVar9 + dVar8 * dVar3;
            lVar17 = lVar17 + 0x10;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar18);
    }
    auVar7._8_4_ = SUB84(*(double *)(alen + 2) + dVar6,0);
    auVar7._0_8_ = *(double *)alen + dVar5;
    auVar7._12_4_ = (int)((ulong)(*(double *)(alen + 2) + dVar6) >> 0x20);
    *(undefined1 (*) [16])alen = auVar7;
    break;
  case 0x3f8:
    if (lVar18 < 1) {
      lVar10 = 0;
    }
    else {
      lVar12 = *hiA;
      lVar11 = *loA;
      lVar17 = 0;
      lVar10 = 0;
      do {
        if (andim < 2) {
          lVar14 = 0;
        }
        else {
          lVar15 = 0;
          lVar14 = 0;
          do {
            lVar13 = *(long *)(local_d8 + lVar15 * 8 + -8);
            if ((lVar17 + 1) % local_68[lVar15 + 1] == 0) {
              *(long *)(local_d8 + lVar15 * 8 + -8) = lVar13 + 1;
            }
            lVar14 = lVar14 + lVar13 * local_a8[lVar15];
            lVar13 = 0;
            if (*(long *)(local_d8 + lVar15 * 8 + -8) <= hiA[lVar15 + 1] - loA[lVar15 + 1]) {
              lVar13 = *(long *)(local_d8 + lVar15 * 8 + -8);
            }
            *(long *)(local_d8 + lVar15 * 8 + -8) = lVar13;
            lVar15 = lVar15 + 1;
          } while (andim + -1 != lVar15);
        }
        if (lVar11 <= lVar12) {
          lVar15 = 0;
          do {
            lVar10 = lVar10 + *(long *)((long)B_ptr + lVar15 * 8 + lVar14 * 8) *
                              *(long *)((long)A_ptr + lVar15 * 8 + lVar14 * 8);
            lVar15 = lVar15 + 1;
          } while ((lVar12 - lVar11) + 1 != lVar15);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != lVar18);
    }
    *(long *)alen = *(long *)alen + lVar10;
  }
  return;
}

Assistant:

static void snga_dot_local_patch(Integer atype, Integer andim, Integer *loA,
                          Integer *hiA, Integer *ldA, void *A_ptr, void *B_ptr,
                          int *alen, void *retval)
{
  int isum;
  double dsum;
  DoubleComplex zsum;
  SingleComplex csum;
  float fsum;
  long lsum;
  long long llsum;
  Integer i, j, n1dim, idx;
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseldA[MAXDIM];

  isum = 0; dsum = 0.; zsum.real = 0.; zsum.imag = 0.; fsum = 0;lsum=0;llsum=0;
  csum.real = 0.; csum.imag = 0.;
  
  /* number of n-element of the first dimension */
  n1dim = 1; for(i=1; i<andim; i++) n1dim *= (hiA[i] - loA[i] + 1);

  /* calculate the destination indices */
  bvalue[0] = 0; bvalue[1] = 0; bunit[0] = 1; bunit[1] = 1;
  /* baseldA[0] = ldA[0]
   * baseldA[1] = ldA[0] * ldA[1]
   * baseldA[2] = ldA[0] * ldA[1] * ldA[2] .....
   */
  baseldA[0] = ldA[0]; baseldA[1] = baseldA[0] *ldA[1];
  for(i=2; i<andim; i++) {
    bvalue[i] = 0;
    bunit[i] = bunit[i-1] * (hiA[i-1] - loA[i-1] + 1);
    baseldA[i] = baseldA[i-1] * ldA[i];
  }

  /* compute "local" contribution to the dot product */
  switch (atype){
    case C_INT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          isum += ((int *)A_ptr)[idx+j] *
            ((int *)B_ptr)[idx+j];
      }
      *(int*)retval += isum;
      break;
    case C_DCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++) {
          DoubleComplex a = ((DoubleComplex *)A_ptr)[idx+j];
          DoubleComplex b = ((DoubleComplex *)B_ptr)[idx+j];
          zsum.real += a.real*b.real  - b.imag * a.imag;
          zsum.imag += a.imag*b.real  + b.imag * a.real;
        }
      }
      ((double*)retval)[0] += zsum.real;
      ((double*)retval)[1] += zsum.imag;
      break;
    case C_SCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++) {
          SingleComplex a = ((SingleComplex *)A_ptr)[idx+j];
          SingleComplex b = ((SingleComplex *)B_ptr)[idx+j];
          csum.real += a.real*b.real  - b.imag * a.imag;
          csum.imag += a.imag*b.real  + b.imag * a.real;
        }
      }
      ((float*)retval)[0] += csum.real;
      ((float*)retval)[1] += csum.imag;
      break;
    case  C_DBL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          dsum += ((double*)A_ptr)[idx+j] *
            ((double*)B_ptr)[idx+j];
      }
      *(double*)retval += dsum;
      break;
    case C_FLOAT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          fsum += ((float *)A_ptr)[idx+j] *
            ((float *)B_ptr)[idx+j];
      }
      *(float*)retval += fsum;
      break;         
    case C_LONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          lsum += ((long *)A_ptr)[idx+j] *
            ((long *)B_ptr)[idx+j];
      }
      *(long*)retval += lsum;
      break;                                     
    case C_LONGLONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          llsum += ((long long *)A_ptr)[idx+j] *
            ((long long *)B_ptr)[idx+j];
      }
      *(long long*)retval += llsum;
      break;
     default:
        pnga_error("snga_dot_local_patch: type not supported",atype);
        
  }
}